

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_byteArray_primitive_char32AtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  ulong uVar4;
  long lVar5;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar4 = (ulong)*(uint *)(uVar1 + 0xc);
  }
  else {
    uVar4 = 0;
  }
  uVar2 = arguments[1];
  if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
    lVar5 = (long)uVar2 >> 4;
  }
  else {
    lVar5 = *(long *)(uVar2 + 0x10);
  }
  if (uVar4 < lVar5 + 4U) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  uVar4 = arguments[2];
  if ((uVar4 & 0xf) == 0) {
    uVar3 = *(undefined4 *)(uVar4 + 0x10);
  }
  else {
    uVar3 = (undefined4)(uVar4 >> 4);
  }
  *(undefined4 *)(uVar1 + 0x10 + lVar5) = uVar3;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_char32AtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t index = sysbvm_tuple_size_decode(arguments[1]);
    if(index + 4 > size) sysbvm_error_outOfBoundsSlotAccess();

    *(uint32_t*)(array->elements + index) = sysbvm_tuple_char32_decode(arguments[2]);
    return SYSBVM_VOID_TUPLE;
}